

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_oram.h
# Opt level: O1

void __thiscall TreeOram::~TreeOram(TreeOram *this)

{
  pointer ppBVar1;
  Bucket<int> *pBVar2;
  pointer piVar3;
  vector<Bucket<int>_*,_std::allocator<Bucket<int>_*>_> *__range1;
  Bucket<int> **v;
  pointer ppBVar4;
  
  ppBVar1 = (this->tree).super__Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppBVar4 = (this->tree).super__Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppBVar4 != ppBVar1; ppBVar4 = ppBVar4 + 1
      ) {
    pBVar2 = *ppBVar4;
    if (pBVar2 != (Bucket<int> *)0x0) {
      piVar3 = (pBVar2->blocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (piVar3 != (pointer)0x0) {
        operator_delete(piVar3);
      }
      operator_delete(pBVar2);
    }
  }
  piVar3 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  ppBVar4 = (this->tree).super__Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppBVar4 != (pointer)0x0) {
    operator_delete(ppBVar4);
    return;
  }
  return;
}

Assistant:

~TreeOram() {
         for(auto & v : tree) 
            delete v;
      }